

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O3

JsValueRef
Debugger::GetBreakOnException
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsRuntimeHandle pvVar4;
  JsValueRef local_30;
  JsValueRef exceptionAttributesRef;
  JsDiagBreakOnExceptionAttributes exceptionAttributes;
  
  if (debugger == (Debugger *)0x0) {
    pvVar4 = (JsRuntimeHandle)0x0;
  }
  else {
    pvVar4 = debugger->m_runtime;
  }
  JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagGetBreakOnException)
                    (pvVar4,(JsDiagBreakOnExceptionAttributes *)((long)&exceptionAttributesRef + 4))
  ;
  if (JVar1 == JsNoError) {
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDoubleToNumber)
                      ((double)exceptionAttributesRef._4_4_,&local_30);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsDoubleToNumber((double)exceptionAttributes, &exceptionAttributesRef) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      local_30 = (JsValueRef)0x0;
    }
  }
  else {
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(JVar1);
    PAL_fwprintf(pPVar2,
                 L"ERROR: ChakraRTInterface::JsDiagGetBreakOnException(Debugger::GetRuntime(), &exceptionAttributes) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar1,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    local_30 = (JsValueRef)0x0;
  }
  return local_30;
}

Assistant:

JsRuntimeHandle Debugger::GetRuntime()
{
    return Debugger::debugger != nullptr ? Debugger::debugger->m_runtime : JS_INVALID_RUNTIME_HANDLE;
}